

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall
helics::CommonCore::processCoreConfigureCommands(CommonCore *this,ActionMessage *cmd)

{
  int iVar1;
  basic_string_view<char,_std::char_traits<char>_> __args_2;
  basic_string_view<char,_std::char_traits<char>_> __args_1;
  string_view lfile;
  bool bVar2;
  __int_type_conflict4 _Var3;
  element_type *peVar4;
  ActionMessage *in_RSI;
  long *in_RDI;
  string_view in_stack_00000070;
  bad_any_cast *anon_var_0_1;
  shared_ptr<helics::FederateOperator> fedop;
  FederateState *fed;
  optional<std::any> locker_1;
  bad_any_cast *anon_var_0;
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  callback;
  optional<std::any> locker;
  int32_t size;
  ActionMessage *in_stack_00000258;
  TranslatorFederate *in_stack_00000260;
  CommonCore *in_stack_00000280;
  ActionMessage *in_stack_00000368;
  FilterFederate *in_stack_00000370;
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *in_stack_fffffffffffffdc8;
  undefined4 uVar5;
  FederateState *in_stack_fffffffffffffdd0;
  any *in_stack_fffffffffffffdd8;
  BrokerBase *in_stack_fffffffffffffde0;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  size_t in_stack_fffffffffffffde8;
  int32_t in_stack_fffffffffffffdf0;
  int32_t in_stack_fffffffffffffdf4;
  BrokerBase *in_stack_fffffffffffffdf8;
  CommonCore *in_stack_fffffffffffffe08;
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *logFunction;
  BrokerBase *in_stack_fffffffffffffe10;
  GlobalFederateId federateID;
  CommonCore *in_stack_fffffffffffffe38;
  GlobalFederateId local_15c [12];
  BaseType local_12c;
  FederateState *local_128;
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  local_108;
  string_view local_e8;
  undefined1 in_stack_ffffffffffffff2b;
  int in_stack_ffffffffffffff2c;
  BrokerBase *in_stack_ffffffffffffff30;
  string_view in_stack_ffffffffffffff38;
  GlobalFederateId in_stack_ffffffffffffff4c;
  GlobalFederateId local_1c;
  BaseType local_18;
  GlobalFederateId local_14;
  ActionMessage *local_10;
  
  iVar1 = in_RSI->messageID;
  if (iVar1 == 0x1d) {
    bVar2 = checkActionFlag<helics::ActionMessage,helics::GeneralFlags>(in_RSI,indicator_flag);
    *(bool *)((long)in_RDI + 0x215) = bVar2;
  }
  else if (iVar1 == 0x1f) {
    bVar2 = checkActionFlag<helics::ActionMessage,helics::GeneralFlags>(in_RSI,indicator_flag);
    *(bool *)((long)in_RDI + 0x215) = bVar2;
    *(bool *)((long)in_RDI + 0xdb) = bVar2;
  }
  else {
    local_10 = in_RSI;
    if (iVar1 == 0x2f) {
      std::__atomic_base<short>::operator--((__atomic_base<short> *)((long)in_RDI + 0x3e4));
      uVar5 = (undefined4)((ulong)in_stack_fffffffffffffdc8 >> 0x20);
      _Var3 = std::__atomic_base::operator_cast_to_short
                        ((__atomic_base<short> *)in_stack_fffffffffffffdd8);
      if (((_Var3 < 1) && (bVar2 = allInitReady(in_stack_fffffffffffffe38), bVar2)) &&
         (bVar2 = BrokerBase::transitionBrokerState
                            ((BrokerBase *)in_stack_fffffffffffffdd0,
                             (BrokerState)((uint)uVar5 >> 0x10),(BrokerState)uVar5), bVar2)) {
        checkDependencies(in_stack_00000280);
        ActionMessage::setAction(local_10,cmd_init);
        local_18 = *(BaseType *)((long)in_RDI + 0x14);
        GlobalFederateId::GlobalFederateId(&local_14,(GlobalBrokerId)local_18);
        (local_10->source_id).gid = local_14.gid;
        GlobalFederateId::GlobalFederateId(&local_1c,(GlobalBrokerId)0x0);
        (local_10->dest_id).gid = local_1c.gid;
        (**(code **)(*in_RDI + 0x358))(in_RDI,0,local_10);
      }
    }
    else if (iVar1 == 0x48) {
      bVar2 = checkActionFlag<helics::ActionMessage,helics::GeneralFlags>(in_RSI,indicator_flag);
      *(bool *)((long)in_RDI + 0xda) = bVar2;
    }
    else if (iVar1 == 0x6d) {
      bVar2 = checkActionFlag<helics::ActionMessage,helics::GeneralFlags>(in_RSI,indicator_flag);
      *(bool *)((long)in_RDI + 0x219) = bVar2;
    }
    else if (iVar1 == 0x6e) {
      bVar2 = checkActionFlag<helics::ActionMessage,helics::GeneralFlags>(in_RSI,indicator_flag);
      *(byte *)((long)in_RDI + 0x219) = (bVar2 ^ 0xffU) & 1;
    }
    else if (iVar1 == 0x10f) {
      ActionMessage::getExtraData((ActionMessage *)0x5538a2);
      BrokerBase::setLogLevel
                ((BrokerBase *)in_stack_fffffffffffffdd0,
                 (int32_t)((ulong)in_stack_fffffffffffffdc8 >> 0x20));
    }
    else if (iVar1 == 0x110) {
      peVar4 = CLI::std::
               __shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x5538dd);
      LogManager::getConsoleLevel(peVar4);
      ActionMessage::getExtraData((ActionMessage *)0x5538f9);
      BrokerBase::setLogLevels
                (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0);
    }
    else if (iVar1 == 0x112) {
      ActionMessage::getExtraData((ActionMessage *)0x553935);
      peVar4 = CLI::std::
               __shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x553954);
      LogManager::getFileLevel(peVar4);
      BrokerBase::setLogLevels
                (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0);
    }
    else if (iVar1 == 0x114) {
      ActionMessage::getExtraData((ActionMessage *)0x553984);
      peVar4 = CLI::std::
               __shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x5539a3);
      LogManager::getLogBuffer(peVar4);
      LogBuffer::resize((LogBuffer *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                        in_stack_fffffffffffffde8);
    }
    else if (iVar1 == 0x23c) {
      if (in_RDI[0x15d] != 0) {
        FilterFederate::handleMessage(in_stack_00000370,in_stack_00000368);
      }
    }
    else if (iVar1 == 0x23e) {
      if (in_RDI[0x129] != 0) {
        TranslatorFederate::handleMessage(in_stack_00000260,in_stack_00000258);
      }
    }
    else if (iVar1 == 0x240) {
      bVar2 = checkActionFlag<helics::ActionMessage,helics::MessageFlags>(in_RSI,empty_flag);
      if (bVar2) {
        logFunction = &local_108;
        std::
        function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
        ::function((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                    *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
        BrokerBase::setLoggerFunction(in_stack_fffffffffffffe10,logFunction);
        std::
        function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
        ::~function((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                     *)0x553e4e);
      }
      else {
        std::array<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>,_4UL>::
        operator[]((array<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>,_4UL>
                    *)in_stack_fffffffffffffdd0,(size_type)in_stack_fffffffffffffdc8);
        federateID.gid = (BaseType)((ulong)in_stack_fffffffffffffe10 >> 0x20);
        gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>::try_unload
                  ((AirLock<std::any,_std::mutex,_std::condition_variable> *)
                   in_stack_fffffffffffffdf8);
        bVar2 = std::optional::operator_cast_to_bool((optional<std::any> *)0x553eb8);
        if (bVar2) {
          local_12c = (local_10->source_id).gid;
          local_128 = getFederateCore(in_stack_fffffffffffffe08,federateID);
          if (local_128 != (FederateState *)0x0) {
            std::optional<std::any>::operator*((optional<std::any> *)0x553f17);
            std::any_cast<std::shared_ptr<helics::FederateOperator>>(in_stack_fffffffffffffdd8);
            std::shared_ptr<helics::FederateOperator>::shared_ptr
                      ((shared_ptr<helics::FederateOperator> *)in_stack_fffffffffffffdd0,
                       (shared_ptr<helics::FederateOperator> *)in_stack_fffffffffffffdc8);
            FederateState::setCallbackOperator
                      (in_stack_fffffffffffffdd0,
                       (shared_ptr<helics::FederateOperator> *)in_stack_fffffffffffffdc8);
            std::shared_ptr<helics::FederateOperator>::~shared_ptr
                      ((shared_ptr<helics::FederateOperator> *)0x553f6e);
            std::shared_ptr<helics::FederateOperator>::~shared_ptr
                      ((shared_ptr<helics::FederateOperator> *)0x553f7b);
          }
        }
        std::optional<std::any>::~optional((optional<std::any> *)0x554016);
      }
    }
    else if (iVar1 == 0x250) {
      bVar2 = checkActionFlag<helics::ActionMessage,helics::MessageFlags>(in_RSI,empty_flag);
      if (bVar2) {
        std::
        function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
        ::function((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                    *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
        BrokerBase::setLoggerFunction
                  (in_stack_fffffffffffffe10,
                   (function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                    *)in_stack_fffffffffffffe08);
        std::
        function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
        ::~function((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                     *)0x553b21);
      }
      else {
        std::array<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>,_4UL>::
        operator[]((array<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>,_4UL>
                    *)in_stack_fffffffffffffdd0,(size_type)in_stack_fffffffffffffdc8);
        gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>::try_unload
                  ((AirLock<std::any,_std::mutex,_std::condition_variable> *)
                   in_stack_fffffffffffffdf8);
        bVar2 = std::optional::operator_cast_to_bool((optional<std::any> *)0x553b8b);
        if (bVar2) {
          std::optional<std::any>::operator*((optional<std::any> *)0x553ba1);
          std::
          any_cast<std::function<void(int,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>>
                    (in_stack_fffffffffffffdd8);
          std::__cxx11::string::operator_cast_to_basic_string_view
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffdd0);
          CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffde0,
                     (char *)in_stack_fffffffffffffdd8);
          __args_1._M_str._0_4_ = in_stack_fffffffffffffdf0;
          __args_1._M_len = in_stack_fffffffffffffde8;
          __args_1._M_str._4_4_ = in_stack_fffffffffffffdf4;
          __args_2._M_str = (char *)in_stack_fffffffffffffde0;
          __args_2._M_len = (size_t)in_stack_fffffffffffffdd8;
          std::
          function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
          ::operator()((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                        *)in_stack_fffffffffffffdd0,(int)((ulong)in_stack_fffffffffffffdc8 >> 0x20),
                       __args_1,__args_2);
          std::
          function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
          ::function((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                      *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
          BrokerBase::setLoggerFunction
                    (in_stack_fffffffffffffe10,
                     (function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                      *)in_stack_fffffffffffffe08);
          std::
          function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
          ::~function((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                       *)0x553c62);
          std::
          function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
          ::~function((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                       *)0x553c6f);
        }
        std::optional<std::any>::~optional((optional<std::any> *)0x553d21);
      }
    }
    else if (iVar1 == 0x252) {
      local_e8 = SmallBuffer::to_string((SmallBuffer *)0x553d5c);
      lfile._M_str._0_4_ = in_stack_fffffffffffffdf0;
      lfile._M_len = in_stack_fffffffffffffde8;
      lfile._M_str._4_4_ = in_stack_fffffffffffffdf4;
      BrokerBase::setLoggingFile(in_stack_fffffffffffffde0,lfile);
    }
    else {
      this_00 = (basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 1);
      GlobalFederateId::GlobalFederateId
                (local_15c,(GlobalBrokerId)*(BaseType *)((long)in_RDI + 0x14));
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffdd0);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (this_00,(char *)in_stack_fffffffffffffdd8);
      BrokerBase::sendToLogger
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff2c,
                 in_stack_ffffffffffffff38,in_stack_00000070,(bool)in_stack_ffffffffffffff2b);
    }
  }
  return;
}

Assistant:

void CommonCore::processCoreConfigureCommands(ActionMessage& cmd)
{
    switch (cmd.messageID) {
        case defs::Flags::ENABLE_INIT_ENTRY:
            --delayInitCounter;
            if (delayInitCounter <= 0) {
                if (allInitReady()) {
                    if (transitionBrokerState(
                            BrokerState::CONNECTED,
                            BrokerState::INITIALIZING)) {  // make sure we only do this once
                        checkDependencies();
                        cmd.setAction(CMD_INIT);
                        cmd.source_id = global_broker_id_local;
                        cmd.dest_id = parent_broker_id;
                        transmit(parent_route_id, cmd);
                    }
                }
            }
            break;
        case defs::Properties::LOG_LEVEL:
            setLogLevel(cmd.getExtraData());
            break;
        case defs::Properties::FILE_LOG_LEVEL:
            setLogLevels(mLogManager->getConsoleLevel(), cmd.getExtraData());
            break;
        case defs::Properties::CONSOLE_LOG_LEVEL:
            setLogLevels(cmd.getExtraData(), mLogManager->getFileLevel());
            break;
        case defs::Properties::LOG_BUFFER: {
            auto size = cmd.getExtraData();
            mLogManager->getLogBuffer().resize((size <= 0) ? 0UL : static_cast<std::size_t>(size));
        }

        break;
        case defs::Flags::ALLOW_REMOTE_CONTROL:
            allowRemoteControl = checkActionFlag(cmd, indicator_flag);
            break;
        case defs::Flags::DISABLE_REMOTE_CONTROL:
            allowRemoteControl = !checkActionFlag(cmd, indicator_flag);
            break;
        case defs::Flags::TERMINATE_ON_ERROR:
            terminate_on_error = checkActionFlag(cmd, indicator_flag);
            break;
        case defs::Flags::SLOW_RESPONDING:
            no_ping = checkActionFlag(cmd, indicator_flag);
            break;
        case defs::Flags::DEBUGGING:
            debugging = no_ping = checkActionFlag(cmd, indicator_flag);
            break;
        case UPDATE_LOGGING_CALLBACK:
            if (checkActionFlag(cmd, empty_flag)) {
                setLoggerFunction(nullptr);
            } else {
                auto locker = dataAirlocks[cmd.counter].try_unload();
                if (locker) {
                    try {
                        auto callback = std::any_cast<
                            std::function<void(int, std::string_view, std::string_view)>>(
                            std::move(*locker));
                        callback(0, identifier, "logging callback activated");
                        setLoggerFunction(std::move(callback));
                    }
                    catch (const std::bad_any_cast&) {
                        // This shouldn't really happen unless someone is being malicious so just
                        // ignore it for now.
                    }
                }
            }
            break;
        case UPDATE_LOGGING_FILE:
            setLoggingFile(cmd.payload.to_string());
            break;
        case UPDATE_FILTER_OPERATOR:
            if (filterFed != nullptr) {
                filterFed->handleMessage(cmd);
            }
            break;
        case UPDATE_TRANSLATOR_OPERATOR:
            if (translatorFed != nullptr) {
                translatorFed->handleMessage(cmd);
            }
            break;
        case UPDATE_FEDERATE_OPERATOR:
            if (checkActionFlag(cmd, empty_flag)) {
                setLoggerFunction(nullptr);
            } else {
                auto locker = dataAirlocks[cmd.counter].try_unload();
                if (locker) {
                    try {
                        auto* fed = getFederateCore(cmd.source_id);
                        if (fed != nullptr) {
                            auto fedop = std::any_cast<std::shared_ptr<FederateOperator>>(
                                std::move(*locker));
                            fed->setCallbackOperator(std::move(fedop));
                        }
                    }
                    catch (const std::bad_any_cast&) {
                        // This shouldn't really happen unless someone is being malicious so just
                        // ignore it for now.
                    }
                }
            }
            break;
        default:
            LOG_WARNING(global_broker_id_local,
                        identifier,
                        "unrecognized configure option passed to core ");
            break;
    }
}